

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O0

int __thiscall
btAlignedObjectArray<btVector3DoubleData_*>::copy
          (btAlignedObjectArray<btVector3DoubleData_*> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long in_RCX;
  int i;
  btVector3DoubleData **dest_local;
  int end_local;
  int start_local;
  btAlignedObjectArray<btVector3DoubleData_*> *this_local;
  
  for (i = (int)dst; i < (int)src; i = i + 1) {
    *(btVector3DoubleData **)(in_RCX + (long)i * 8) = this->m_data[i];
  }
  return i;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}